

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

int __thiscall
clunk::Node::Search<(clunk::NodeType)0,true>(Node *this,int alpha,int beta,int depth,bool cutNode)

{
  HashEntry *this_00;
  Node *pNVar1;
  Move MVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint32_t uVar8;
  long lVar9;
  uint32_t eval;
  uint uVar10;
  char cVar11;
  Move *pMVar12;
  Move *pMVar13;
  Move *pMVar14;
  uint uVar15;
  Move *pMVar16;
  uint32_t beta_00;
  Move *pMVar17;
  uint32_t local_74;
  Move firstMove;
  uint32_t local_68;
  uint32_t local_64;
  uint local_5c;
  
  if (this->parent == (Node *)0x0) {
    __assert_fail("parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6d,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if (this->ply < 1) {
    __assert_fail("ply > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6e,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf6f,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  uVar5 = -alpha;
  if (0 < alpha) {
    uVar5 = alpha;
  }
  if (32000 < uVar5) {
    __assert_fail("abs(alpha) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf70,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  uVar5 = -beta;
  if (0 < beta) {
    uVar5 = beta;
  }
  if (32000 < uVar5) {
    __assert_fail("abs(beta) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf71,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if (depth < 1) {
    __assert_fail("depth > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf72,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if ((cutNode) && (bVar3 = Move::IsValid(&this->lastMove), !bVar3)) {
    __assert_fail("cutNode ? lastMove.IsValid() : true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf74,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  _stats._48_8_ = _stats._48_8_ + 1;
  this->moveIndex = 0;
  this->moveCount = 0;
  this->depthChange = 0;
  this->pvCount = 0;
  if ((99 < this->rcount || (this->state & 0x20U) != 0) || (bVar3 = HasRepeated(this), bVar3)) {
    iVar4 = DAT_0017ea54;
    this->standPat = DAT_0017ea54;
    return iVar4;
  }
  iVar4 = this->ply;
  local_74 = iVar4 - 32000;
  if (alpha < (int)local_74) {
    alpha = local_74;
  }
  beta_00 = 0x7d01U - iVar4;
  if (beta <= (int)(0x7d01U - iVar4)) {
    beta_00 = beta;
  }
  if (this->child == (Node *)0x0 || (int)beta_00 <= alpha) {
    return alpha;
  }
  if ((this->checks != 0) && (this->parent->depthChange < 1)) {
    _stats._64_8_ = _stats._64_8_ + 1;
    this->depthChange = this->depthChange + 1;
    depth = depth + 1;
  }
  firstMove.bits = 0;
  firstMove.score = 0;
  if (DAT_0017fcd0 == 0) {
    __assert_fail("keyMask",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0xf7,
                  "EntryType *clunk::TranspositionTable<clunk::HashEntry>::Get(const uint64_t) [EntryType = clunk::HashEntry]"
                 );
  }
  if (DAT_0017fcd8 == 0) {
    __assert_fail("entries",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/HashTable.h"
                  ,0xf8,
                  "EntryType *clunk::TranspositionTable<clunk::HashEntry>::Get(const uint64_t) [EntryType = clunk::HashEntry]"
                 );
  }
  _tt = _tt + 1;
  lVar9 = (DAT_0017fcd0 & this->positionKey) * 0x10;
  this_00 = (HashEntry *)(DAT_0017fcd8 + lVar9);
  if (*(ulong *)(DAT_0017fcd8 + lVar9) == this->positionKey) {
    DAT_0017fcb8 = DAT_0017fcb8 + 1;
    uVar8 = local_74;
    switch(this_00->flags & 7) {
    case 1:
      goto switchD_001335d1_caseD_1;
    case 2:
      goto switchD_001335d1_caseD_2;
    case 3:
      local_74 = this_00->moveBits;
      iVar4 = HashEntry::Score(this_00,iVar4);
      Move::Init(&firstMove,local_74,iVar4);
      iVar4 = ValidateMove<true>(this,&firstMove);
      if (iVar4 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf9c,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
      if ((((this_00->flags & 0x10) != 0) && (depth <= (int)(uint)this_00->depth)) &&
         (firstMove.score <= alpha)) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        return firstMove.score;
      }
      break;
    case 4:
      local_74 = this_00->moveBits;
      iVar4 = HashEntry::Score(this_00,iVar4);
      Move::Init(&firstMove,local_74,iVar4);
      iVar4 = ValidateMove<true>(this,&firstMove);
      if (iVar4 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa8,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
      if ((this_00->flags & 0x10) == 0) {
        __assert_fail("entry->HasPvFlag()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfa9,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
      if ((depth <= (int)(uint)this_00->depth) &&
         (firstMove.score <= alpha || (int)beta_00 <= firstMove.score)) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        if (firstMove.score < (int)beta_00) {
          if ((alpha < firstMove.score) &&
             ((((ulong)firstMove & 0xff00000) == 0 && this->checks == 0) &&
              (firstMove.bits & 0xf) != 3)) {
            IncHistory(&firstMove,depth);
          }
        }
        else {
          AddKiller(this,&firstMove,depth);
        }
        return firstMove.score;
      }
      break;
    case 5:
      local_74 = this_00->moveBits;
      iVar4 = HashEntry::Score(this_00,iVar4);
      Move::Init(&firstMove,local_74,iVar4);
      iVar4 = ValidateMove<true>(this,&firstMove);
      if (iVar4 != 0) {
        __assert_fail("ValidateMove<color>(firstMove) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xfbf,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
      if ((((this_00->flags & 0x10) != 0) && (depth <= (int)(uint)this_00->depth)) &&
         ((int)beta_00 <= firstMove.score)) {
        Move::operator=(this->pv,&firstMove);
        this->pvCount = 1;
        AddKiller(this,&firstMove,depth);
        return firstMove.score;
      }
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xfca,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                   );
    }
    if (((this->depthChange < 1) && (this->parent->depthChange < 1)) && ((this_00->flags & 8) != 0))
    {
      _stats._80_8_ = _stats._80_8_ + 1;
      this->depthChange = this->depthChange + 1;
      depth = depth + 1;
    }
  }
  if (this->depthChange < 0) {
    __assert_fail("depthChange >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd5,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if (this->moveIndex != 0) {
    __assert_fail("!moveIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd6,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if (this->moveCount != 0) {
    __assert_fail("!moveCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd7,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if (this->pvCount != 0) {
    __assert_fail("!pvCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xfd8,
                  "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                 );
  }
  if (depth < 4 || ((ulong)firstMove & 0xf) != 0) {
    if (((ulong)firstMove & 0xf) == 0) {
      GenerateMoves<true,false>(this,depth);
      uVar5 = this->moveCount;
      if ((int)uVar5 < 1) {
        if (this->checks != 0) {
          HashEntry::SetCheckmate(this_00,this->positionKey);
          DAT_0017fcc0 = DAT_0017fcc0 + 1;
          return this->ply + -32000;
        }
        HashEntry::SetStalemate(this_00,this->positionKey);
        DAT_0017fcc8 = DAT_0017fcc8 + 1;
switchD_001335d1_caseD_2:
        iVar4 = DAT_0017ea54;
        this->standPat = DAT_0017ea54;
        return iVar4;
      }
      lVar9 = (long)this->moveIndex;
      if (lVar9 < 0) {
LAB_001341c7:
        __assert_fail("moveIndex >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x914,"Move *clunk::Node::GetNextMove()");
      }
      if (0x7f < uVar5) {
LAB_001341a8:
        __assert_fail("(moveCount >= 0) & (moveCount < MaxMoves)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x915,"Move *clunk::Node::GetNextMove()");
      }
      pMVar17 = this->moves + lVar9;
      uVar10 = this->moveIndex + 1;
      pMVar13 = pMVar17;
      if ((int)uVar10 < (int)uVar5) {
        pMVar16 = this->moves + uVar10;
        pMVar12 = pMVar17;
        uVar15 = uVar10;
        do {
          pMVar13 = pMVar16;
          if (pMVar16->score <= pMVar12->score) {
            pMVar13 = pMVar12;
          }
          uVar15 = uVar15 + 1;
          pMVar16 = pMVar16 + 1;
          pMVar12 = pMVar13;
        } while ((int)uVar15 < (int)uVar5);
      }
      if (pMVar13 != pMVar17) {
        MVar2 = this->moves[lVar9];
        this->moves[lVar9].bits = pMVar13->bits;
        this->moves[lVar9].score = pMVar13->score;
        *pMVar13 = MVar2;
      }
      this->moveIndex = uVar10;
      Move::operator=(&firstMove,pMVar17);
      if (this->moveIndex != 1) {
        __assert_fail("moveIndex == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1023,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
    }
  }
  else {
    _stats._144_8_ = _stats._144_8_ + 1;
    iVar4 = Search<(clunk::NodeType)1,true>(this,beta_00 - 1,beta_00,depth - 2,false);
    if (this->pvCount == 0 || _stop != 0) {
      return iVar4;
    }
    if (this->moveCount < 1) {
      __assert_fail("moveCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100b,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                   );
    }
    if (this->pvCount < 1) {
      __assert_fail("pvCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100c,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                   );
    }
    bVar3 = Move::IsValid(this->pv);
    if (!bVar3) {
      __assert_fail("pv[0].IsValid()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0x100d,
                    "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                   );
    }
    Move::operator=(&firstMove,this->pv);
    this->moveIndex = 1;
  }
  if (((this->moveCount == 1) && (this->depthChange < 1)) && (this->parent->depthChange < 1)) {
    _stats._72_8_ = _stats._72_8_ + 1;
    this->depthChange = this->depthChange + 1;
    depth = depth + 1;
  }
  Exec<true>(this,&firstMove,this->child);
  iVar4 = -beta_00;
  if (depth < 2) {
    uVar5 = QSearch<false>(this->child,iVar4,-alpha,0);
  }
  else {
    uVar5 = Search<(clunk::NodeType)0,false>(this->child,iVar4,-alpha,depth - 1,!cutNode);
  }
  Undo<true>(this,&firstMove);
  uVar8 = beta_00;
  if (_stop == 0) {
    uVar10 = this->child->depthChange;
    pMVar13 = this->pv;
    Move::operator=(pMVar13,&firstMove);
    pNVar1 = this->child;
    if (pNVar1 == (Node *)0x0) {
      this->pvCount = 1;
    }
    else {
      iVar6 = pNVar1->pvCount;
      this->pvCount = iVar6 + 1;
      if (0 < iVar6) {
        if (99 < iVar6) {
LAB_00134490:
          __assert_fail("pvCount <= MaxPlies",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xc50,"void clunk::Node::UpdatePV(const Move &)");
        }
        memcpy(this->pv + 1,pNVar1->pv,(long)pNVar1->pvCount << 3);
      }
    }
    local_68 = -uVar5;
    local_5c = ((int)uVar10 >> 0x1f & uVar10) + depth;
    if (beta_00 == local_68 || SBORROW4(beta_00,local_68) != (int)(beta_00 + uVar5) < 0) {
      if ((int)uVar10 < 0) {
        __assert_fail("pvDepth == depth",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x103a,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
      AddKiller(this,&firstMove,local_5c);
      uVar10 = -uVar5;
      if (0 < (int)uVar5) {
        uVar10 = uVar5;
      }
      if (31000 < uVar10) {
        beta_00 = local_68;
      }
      HashEntry::Set(this_00,this->positionKey,&firstMove,beta_00,this->ply,local_5c,5,
                     (uint)(0 < this->depthChange) * 8 + 0x10);
      uVar8 = local_68;
    }
    else {
      if (SBORROW4(alpha,local_68) == (int)(alpha + uVar5) < 0) {
        local_64 = alpha;
        if (((firstMove.bits & 0xf) != 3 && ((ulong)firstMove & 0xff00000) == 0) &&
            this->checks == 0) {
          cVar11 = -1;
          if (-1 < (char)_hist[firstMove.bits & 0xfff]) {
            cVar11 = _hist[firstMove.bits & 0xfff];
          }
          _hist[firstMove.bits & 0xfff] = cVar11 + -1;
        }
      }
      else {
        local_64 = local_68;
        if ((int)uVar10 < 0) {
          __assert_fail("pvDepth == depth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1044,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                       );
        }
      }
      if (this->moveCount < 1) {
        GenerateMoves<true,false>(this,depth);
        if (this->moveCount < 1) {
          __assert_fail("moveCount > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x104e,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                       );
        }
        if ((this->moveCount == 1) && (this->moves[0].bits != firstMove.bits)) {
          __assert_fail("(moveCount == 1) ? (moves[0] == firstMove) : true",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x104f,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                       );
        }
      }
      if (1 < this->moveIndex) {
        __assert_fail("moveIndex <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1052,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
      if (this->moveCount < this->moveIndex) {
        __assert_fail("moveIndex <= moveCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x1053,
                      "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                     );
      }
      do {
        do {
          iVar6 = this->moveIndex;
          lVar9 = (long)iVar6;
          if (lVar9 < 0) goto LAB_001341c7;
          uVar5 = this->moveCount;
          if (0x7f < uVar5) goto LAB_001341a8;
          if (iVar6 < (int)uVar5) {
            pMVar17 = this->moves + lVar9;
            uVar10 = iVar6 + 1;
            pMVar12 = pMVar17;
            if ((int)uVar10 < (int)uVar5) {
              pMVar14 = this->moves + uVar10;
              pMVar16 = pMVar17;
              uVar15 = uVar10;
              do {
                pMVar12 = pMVar14;
                if (pMVar14->score <= pMVar16->score) {
                  pMVar12 = pMVar16;
                }
                uVar15 = uVar15 + 1;
                pMVar14 = pMVar14 + 1;
                pMVar16 = pMVar12;
              } while ((int)uVar15 < (int)uVar5);
            }
            if (pMVar12 != pMVar17) {
              MVar2 = this->moves[lVar9];
              this->moves[lVar9].bits = pMVar12->bits;
              this->moves[lVar9].score = pMVar12->score;
              *pMVar12 = MVar2;
            }
            this->moveIndex = uVar10;
          }
          else {
            pMVar17 = (Move *)0x0;
          }
          if (pMVar17 == (Move *)0x0) {
            if (uVar5 == 0) {
              __assert_fail("moveCount > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a3,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                           );
            }
            if ((int)local_64 < (int)local_68) {
              __assert_fail("best <= alpha",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a4,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                           );
            }
            if ((int)beta_00 <= (int)local_64) {
              __assert_fail("alpha < beta",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a5,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                           );
            }
            if (this->pvCount < 1) {
              return local_68;
            }
            if ((int)local_5c < 0) {
              __assert_fail("pvDepth >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10a8,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                           );
            }
            bVar3 = Move::IsValid(pMVar13);
            if (bVar3) {
              uVar5 = this->pv[0].bits;
              if (((uVar5 & 0xf) != 3 && (uVar5 & 0xff00000) == 0) && this->checks == 0) {
                IncHistory(pMVar13,depth);
              }
              if ((int)local_68 <= alpha) {
                if (local_64 == alpha) {
                  HashEntry::Set(this_00,this->positionKey,pMVar13,local_64,this->ply,local_5c,3,
                                 (uint)(0 < this->depthChange) * 8 + 0x10);
                  return local_68;
                }
                __assert_fail("alpha == orig_alpha",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x10b6,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                             );
              }
              if (local_5c == depth) {
                HashEntry::Set(this_00,this->positionKey,pMVar13,local_68,this->ply,local_5c,4,
                               (uint)(0 < this->depthChange) * 8 + 0x10);
                return local_68;
              }
              __assert_fail("pvDepth == depth",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x10af,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                           );
            }
            __assert_fail("pv[0].IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x10a9,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                         );
          }
          bVar3 = Move::IsValid(pMVar17);
          if (!bVar3) {
            __assert_fail("move->IsValid()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x1059,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                         );
          }
        } while (firstMove.bits == pMVar17->bits);
        _stats._192_8_ = _stats._192_8_ + 1;
        Exec<true>(this,pMVar17,this->child);
        iVar6 = -local_64;
        if (depth < 2) {
          iVar7 = QSearch<false>(this->child,~local_64,iVar6,0);
        }
        else {
          iVar7 = Search<(clunk::NodeType)1,false>(this->child,~local_64,iVar6,depth - 1U,true);
        }
        uVar8 = -iVar7;
        if ((SBORROW4(local_64,uVar8) != (int)(local_64 + iVar7) < 0) && (_stop == 0)) {
          pNVar1 = this->child;
          if (pNVar1->depthChange < 0) {
            __assert_fail("child->depthChange >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                          ,0x1074,
                          "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                         );
          }
          _stats._232_8_ = _stats._232_8_ + 1;
          _stats._216_8_ = _stats._216_8_ + 1;
          if (depth < 2) {
            iVar6 = QSearch<false>(pNVar1,iVar4,iVar6,0);
          }
          else {
            iVar6 = Search<(clunk::NodeType)0,false>(pNVar1,iVar4,iVar6,depth - 1U,false);
          }
          uVar8 = -iVar6;
          _stats._224_8_ =
               _stats._224_8_ + (ulong)(SBORROW4(local_64,uVar8) != (int)(local_64 + iVar6) < 0);
        }
        if (this->child->depthChange <= ~depth) {
          __assert_fail("(depth + child->depthChange) >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0x1086,
                        "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                       );
        }
        Undo<true>(this,pMVar17);
        if (_stop == 0) {
          if ((int)local_68 < (int)uVar8) {
            uVar5 = this->child->depthChange;
            Move::operator=(pMVar13,pMVar17);
            pNVar1 = this->child;
            if (pNVar1 == (Node *)0x0) {
              this->pvCount = 1;
            }
            else {
              iVar6 = pNVar1->pvCount;
              this->pvCount = iVar6 + 1;
              if (0 < iVar6) {
                if (99 < iVar6) goto LAB_00134490;
                memcpy(this->pv + 1,pNVar1->pv,(long)pNVar1->pvCount << 3);
              }
            }
            local_5c = ((int)uVar5 >> 0x1f & uVar5) + depth;
            local_68 = uVar8;
            if ((int)beta_00 <= (int)uVar8) {
              if ((int)uVar5 < 0) {
                __assert_fail("pvDepth == depth",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                              ,0x1090,
                              "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                             );
              }
              AddKiller(this,pMVar17,local_5c);
              uVar5 = -uVar8;
              if (0 < (int)uVar8) {
                uVar5 = uVar8;
              }
              eval = beta_00;
              if (31000 < uVar5) {
                eval = uVar8;
              }
              HashEntry::Set(this_00,this->positionKey,pMVar17,eval,this->ply,local_5c,5,
                             (uint)(0 < this->depthChange) * 8 + 0x10);
              bVar3 = false;
              local_74 = uVar8;
              goto LAB_00133e09;
            }
          }
          if ((int)local_64 < (int)uVar8) {
            bVar3 = true;
            local_64 = uVar8;
            if (local_5c != depth) {
              __assert_fail("pvDepth == depth",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                            ,0x109b,
                            "int clunk::Node::Search(int, int, int, const bool) [type = clunk::PV, color = true]"
                           );
            }
          }
          else {
            uVar5 = pMVar17->bits;
            bVar3 = true;
            if (((uVar5 & 0xf) != 3 && (uVar5 & 0xff00000) == 0) && this->checks == 0) {
              cVar11 = _hist[uVar5 & 0xfff];
              if ((char)_hist[uVar5 & 0xfff] < '\0') {
                cVar11 = -1;
              }
              _hist[uVar5 & 0xfff] = cVar11 + -1;
            }
          }
        }
        else {
          bVar3 = false;
          local_74 = beta_00;
        }
LAB_00133e09:
        uVar8 = local_74;
      } while (bVar3);
    }
  }
switchD_001335d1_caseD_1:
  local_74 = uVar8;
  return local_74;
}

Assistant:

int Search(int alpha, int beta, int depth, const bool cutNode) {
    assert(parent);
    assert(ply > 0);
    assert(alpha < beta);
    assert(abs(alpha) <= Infinity);
    assert(abs(beta) <= Infinity);
    assert(depth > 0);
    assert((type == PV) | ((alpha + 1) == beta));
    assert(cutNode ? lastMove.IsValid() : true);

    _stats.snodes++;
    moveIndex   = 0;
    moveCount   = 0;
    pvCount     = 0;
    depthChange = 0;

    if (IsDraw()) {
      return (standPat = _drawScore[color]);
    }

    // mate distance pruning
    int best = (ply - Infinity);
    alpha = std::max<int>(best, alpha);
    beta = std::min<int>((Infinity - ply + 1), beta);
    if ((alpha >= beta) | !child) {
      return alpha;
    }

    // check extensions
    if (checks && (parent->depthChange <= 0)) {
      _stats.chkExts++;
      depthChange++;
      depth++;
    }

    const bool pvNode = (type == PV);
    int eval = Infinity;
    Move firstMove;

    // transposition table lookup
    HashEntry* entry = _tt.Get(positionKey);
    if (entry->Key() == positionKey) {
      _tt.IncHits();
      switch (entry->GetPrimaryFlag()) {
      case HashEntry::Checkmate: return (ply - Infinity);
      case HashEntry::Stalemate: return (standPat = _drawScore[color]);
      case HashEntry::UpperBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() <= alpha)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::ExactScore:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        assert(entry->HasPvFlag());
        if ((entry->Depth() >= depth) &
            ((!pvNode) |
             (firstMove.GetScore() <= alpha) |
             (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          if (firstMove.GetScore() >= beta) {
            AddKiller(firstMove, depth);
          }
          else if ((!checks) & (firstMove.GetScore() > alpha) &
                   (!firstMove.IsCapOrPromo()))
          {
            IncHistory(firstMove, depth);
          }
          return firstMove.GetScore();
        }
        eval = firstMove.GetScore();
        break;
      case HashEntry::LowerBound:
        firstMove.Init(entry->MoveBits(), entry->Score(ply));
        assert(ValidateMove<color>(firstMove) == 0);
        if (((!pvNode) | entry->HasPvFlag()) &&
            ((entry->Depth() >= depth) & (firstMove.GetScore() >= beta)))
        {
          pv[0] = firstMove;
          pvCount = 1;
          AddKiller(firstMove, depth);
          return firstMove.GetScore();
        }
        break;
      default:
        assert(false);
      }
      if (((depthChange <= 0) & (parent->depthChange <= 0)) &&
          entry->HasExtendedFlag())
      {
        _stats.hashExts++;
        depthChange++;
        depth++;
      }
    }

    assert(depthChange >= 0);
    assert(!moveIndex);
    assert(!moveCount);
    assert(!pvCount);

    // forward pruning (the risky stuff)
    if ((cutNode & (!pvNode) & (!depthChange) & (!checks)) &&
        !IsKiller(lastMove) &&
        ((_pcount[color] + _pcount[color|Knight]) > 1) &&
        ((_pcount[color] + _pcount[color|Knight] + _pcount[color|Pawn] > 2)))
    {
      assert((alpha + 1) == beta);
      Evaluate();
      eval = std::min<int>(eval, standPat);

      // static null move pruning
      if (depth == 1) {
        if ((eval >= (beta + (3 * PawnValue))) & (abs(beta) < WinningScore)) {
          _stats.staticNM++;
          depthChange = -1;
          return beta;
        }
      }

      // null move pruning
      else if (eval >= beta) {
        ExecNullMove<color>(*child);
        const int rdepth = (depth - 3 - (depth / 6) - ((eval - 500) >= beta));
        eval = (rdepth > 0)
            ? -child->Search<NonPV, !color>(-beta, -alpha, rdepth, false)
            : -child->QSearch<!color>(-beta, -alpha, 0);
        if (_stop) {
          return beta;
        }
        if (eval >= beta) {
          _stats.nmCutoffs++;
          depthChange = -depth;
          return std::max<int>(standPat, beta); // do not return eval
        }
      }
    }

    assert(!moveIndex);
    assert(!moveCount);

    // internal iterative deepening
    if ((!firstMove) & (depth > 3)) {
      assert(!moveCount);
      assert(!pvCount);
      _stats.iidCount++;
      eval = Search<NonPV, color>((beta - 1), beta, (depth - 2), false);
      if (_stop | !pvCount) {
        return eval;
      }
      assert(moveCount > 0);
      assert(pvCount > 0);
      assert(pv[0].IsValid());
      firstMove = pv[0];
      moveIndex = 1;
    }

    // make sure firstMove is populated
    else if (!firstMove) {
      assert(!moveCount);
      assert(!pvCount);
      GenerateMoves<color, false>(depth);
      if (moveCount <= 0) {
        if (checks) {
          entry->SetCheckmate(positionKey);
          _tt.IncCheckmates();
          return (ply - Infinity);
        }
        entry->SetStalemate(positionKey);
        _tt.IncStalemates();
        return (standPat = _drawScore[color]);
      }

      firstMove = *GetNextMove();
      assert(moveIndex == 1);
    }

    // single reply extensions
    if ((moveCount == 1) & (depthChange <= 0) & (parent->depthChange <= 0)) {
      _stats.oneReplyExts++;
      depthChange++;
      depth++;
    }

    // search first move with full alpha/beta window
    const int orig_alpha = alpha;
    Exec<color>(firstMove, *child);
    best = (depth > 1)
        ? -child->Search<type, !color>(-beta, -alpha, (depth - 1), !cutNode)
        : -child->QSearch<!color>(-beta, -alpha, 0);
    Undo<color>(firstMove);
    if (_stop) {
      return beta;
    }
    int pvDepth = (depth + std::min<int>(0, child->depthChange));
    UpdatePV(firstMove);
    if (best >= beta) {
      assert(pvDepth == depth);
      AddKiller(firstMove, pvDepth);
      eval = ((abs(best) > MateScore) ? best : beta);
      entry->Set(positionKey, firstMove, eval, ply, pvDepth,
                 HashEntry::LowerBound,
                 (((depthChange > 0) ? HashEntry::Extended : 0) |
                  (pvNode ? HashEntry::FromPV : 0)));
      return best;
    }
    if (best > alpha) {
      assert(pvDepth == depth);
      alpha = best;
    }
    else if (!(checks | firstMove.IsCapOrPromo())) {
      DecHistory(firstMove);
    }

    // generate moves if we haven't done so already
    if (moveCount <= 0) {
      GenerateMoves<color, false>(depth);
      assert(moveCount > 0);
      assert((moveCount == 1) ? (moves[0] == firstMove) : true);
    }

    assert(moveIndex <= 1);
    assert(moveIndex <= moveCount);

    // search remaining moves
    const bool lmrOK = ((!pvNode) & (depth > 2) & (!checks));
    Move* move;
    while ((move = GetNextMove())) {
      assert(move->IsValid());
      if (firstMove == (*move)) {
        continue;
      }

      _stats.lateMoves++;
      Exec<color>(*move, *child);

      // late move reductions
      int d = (depth - 1);
      if (lmrOK) {
        _stats.lmCandidates++;
        if (!(move->IsCapOrPromo() | IsKiller(*move) | child->checks) &&
            (_hist[move->TypeToIndex()] < depth))
        {
          _stats.lmReductions++;
          d -= (1 + (_hist[move->TypeToIndex()] < 0));
        }
      }

      // first search with a null window to quickly see if it improves alpha
      eval = (d > 0)
          ? -child->Search<NonPV, !color>(-(alpha + 1), -alpha, d, true)
          : -child->QSearch<!color>(-(alpha + 1), -alpha, 0);

      // re-search it?
      if ((!_stop) & (eval > alpha)) {
        assert(child->depthChange >= 0);
        _stats.lmAlphaIncs++;
        if (pvNode) {
          assert(d == (depth - 1));
          _stats.lmResearches++;
          eval = (d > 0)
              ? -child->Search<PV, !color>(-beta, -alpha, d, false)
              : -child->QSearch<!color>(-beta, -alpha, 0);
        }
        else if (d < (depth - 1)) {
          assert((alpha + 1) == beta);
          _stats.lmResearches++;
          d = (depth - 1);
          eval = -child->Search<NonPV, !color>(-beta, -alpha, d, false);
        }
        _stats.lmConfirmed += (eval > alpha);
      }

      assert((depth + child->depthChange) >= 0);
      Undo<color>(*move);
      if (_stop) {
        return beta;
      }
      if (eval > best) {
        best = eval;
        pvDepth = (depth + std::min<int>(0, child->depthChange));
        UpdatePV(*move);
        if (eval >= beta) {
          assert(pvDepth == depth);
          AddKiller(*move, pvDepth);
          eval = ((abs(best) > MateScore) ? best : beta);
          entry->Set(positionKey, *move, eval, ply, pvDepth,
                     HashEntry::LowerBound,
                     (((depthChange > 0) ? HashEntry::Extended : 0) |
                      (pvNode ? HashEntry::FromPV : 0)));
          return best;
        }
      }
      if (eval > alpha) {
        assert(pvDepth == depth);
        alpha = eval;
      }
      else if (!(checks | move->IsCapOrPromo())) {
        DecHistory(*move);
      }
    }

    assert(moveCount > 0);
    assert(best <= alpha);
    assert(alpha < beta);

    if (pvCount > 0) {
      assert(pvDepth >= 0);
      assert(pv[0].IsValid());
      if (!(checks | pv[0].IsCapOrPromo())) {
        IncHistory(pv[0], depth);
      }
      if (best > orig_alpha) {
        assert(pvNode);
        assert(pvDepth == depth);
        entry->Set(positionKey, pv[0], best, ply, pvDepth,
            HashEntry::ExactScore,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             HashEntry::FromPV));
      }
      else {
        assert(alpha == orig_alpha);
        entry->Set(positionKey, pv[0], alpha, ply, pvDepth,
            HashEntry::UpperBound,
            (((depthChange > 0) ? HashEntry::Extended : 0) |
             (pvNode ? HashEntry::FromPV : 0)));
      }
    }

    return best;
  }